

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O3

Matrix6x6 * __thiscall iDynTree::ArticulatedBodyInertia::asMatrix(ArticulatedBodyInertia *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  Matrix6x6 *in_RDI;
  
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)(this->linearLinear).m_data + lVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)in_RDI->m_data + lVar4 * 2);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    *(undefined8 *)((long)in_RDI->m_data + lVar4 * 2 + 0x10) =
         *(undefined8 *)((long)(this->linearLinear).m_data + lVar4 + 0x10);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)(this->linearAngular).m_data + lVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)in_RDI->m_data + lVar4 * 2 + 0x18);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    *(undefined8 *)((long)in_RDI->m_data + lVar4 * 2 + 0x28) =
         *(undefined8 *)((long)(this->linearAngular).m_data + lVar4 + 0x10);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  in_RDI->m_data[0x12] = (this->linearAngular).m_data[0];
  in_RDI->m_data[0x13] = (this->linearAngular).m_data[3];
  in_RDI->m_data[0x14] = (this->linearAngular).m_data[6];
  in_RDI->m_data[0x18] = (this->linearAngular).m_data[1];
  in_RDI->m_data[0x19] = (this->linearAngular).m_data[4];
  in_RDI->m_data[0x1a] = (this->linearAngular).m_data[7];
  in_RDI->m_data[0x1e] = (this->linearAngular).m_data[2];
  in_RDI->m_data[0x1f] = (this->linearAngular).m_data[5];
  in_RDI->m_data[0x20] = (this->linearAngular).m_data[8];
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)(this->angularAngular).m_data + lVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)in_RDI->m_data + lVar4 * 2 + 0xa8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    *(undefined8 *)((long)in_RDI->m_data + lVar4 * 2 + 0xb8) =
         *(undefined8 *)((long)(this->angularAngular).m_data + lVar4 + 0x10);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  return in_RDI;
}

Assistant:

Matrix6x6 ArticulatedBodyInertia::asMatrix() const
{
    Matrix6x6 retMat;

    Eigen::Map<Matrix6dRowMajor> retMatEigen(retMat.data());

    retMatEigen.block<3,3>(0,0) = toEigen(linearLinear);
    retMatEigen.block<3,3>(0,3) = toEigen(linearAngular);
    retMatEigen.block<3,3>(3,0) = toEigen(linearAngular).transpose();
    retMatEigen.block<3,3>(3,3) = toEigen(angularAngular);

    return retMat;
}